

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# twolevel.c
# Opt level: O2

void evict_demote(VMEMcache *cache,void *key,size_t key_size,void *arg)

{
  long lVar1;
  void *__ptr;
  size_t sVar2;
  undefined8 local_38;
  size_t vsize;
  
  lVar1 = vmemcache_get();
  if (lVar1 == 0) {
    __ptr = malloc(local_38);
    if (__ptr != (void *)0x0) {
      sVar2 = vmemcache_get(cache,key,key_size,__ptr,local_38,0,0);
      if (sVar2 == local_38) {
        vmemcache_put(arg,key,key_size,__ptr,sVar2);
      }
      free(__ptr);
    }
  }
  return;
}

Assistant:

static void
evict_demote(VMEMcache *cache, const void *key, size_t key_size, void *arg)
{
	VMEMcache *colder = (VMEMcache *)arg;

	size_t vsize;
	/* First, obtain the value's size. */
	if (vmemcache_get(cache, key, key_size, NULL, 0, 0, &vsize))
		return; /* Somehow got deleted? -- can't happen. */
	void *buf = malloc(vsize);
	if (!buf)
		return;
	/* Then, fetch the value. */
	if (vmemcache_get(cache, key, key_size, buf, vsize, 0, NULL) ==
		(ssize_t)vsize) {
		/* Again, it's not supposed to be missing. */
		vmemcache_put(colder, key, key_size, buf, vsize);
	}
	free(buf);
}